

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<unsigned_int>::SetRange
          (CharSet<unsigned_int> *this,ArenaAllocator *allocator,Char lc,Char hc)

{
  code *pcVar1;
  bool bVar2;
  char16 cVar3;
  char16 hc_00;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  long lVar7;
  CharSet<char16_t> *this_00;
  long lVar8;
  
  if (hc < lc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x623,"(lc <= hc)","lc <= hc");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  iVar4 = CharToIndex(this,lc);
  iVar5 = CharToIndex(this,hc);
  if (iVar4 == iVar5) {
    lVar7 = (long)iVar4;
    cVar3 = RemoveOffset(this,lc);
    hc_00 = RemoveOffset(this,hc);
  }
  else {
    cVar3 = RemoveOffset(this,lc);
    hc_00 = RemoveOffset(this,hc);
    if (cVar3 != L'\0') {
      CharSet<char16_t>::SetRange(this->characterPlanes + iVar4,allocator,cVar3,L'\xffff');
      iVar4 = iVar4 + 1;
    }
    lVar8 = (long)iVar4;
    lVar7 = (long)iVar5;
    this_00 = this->characterPlanes + lVar8;
    for (; lVar8 < lVar7; lVar8 = lVar8 + 1) {
      CharSet<char16_t>::SetRange(this_00,allocator,L'\0',L'\xffff');
      this_00 = this_00 + 1;
    }
    cVar3 = L'\0';
  }
  CharSet<char16_t>::SetRange(this->characterPlanes + lVar7,allocator,cVar3,hc_00);
  return;
}

Assistant:

void CharSet<codepoint_t>::SetRange(ArenaAllocator* allocator, Char lc, Char hc)
    {
        Assert(lc <= hc);

        int lowerIndex = this->CharToIndex(lc);
        int upperIndex = this->CharToIndex(hc);

        if (lowerIndex == upperIndex)
        {
            this->characterPlanes[lowerIndex].SetRange(allocator, this->RemoveOffset(lc), this->RemoveOffset(hc));
        }
        else
        {
            // Do the partial ranges
            char16 partialLower = this->RemoveOffset(lc);
            char16 partialHigher = this->RemoveOffset(hc);

            if (partialLower != 0)
            {
                this->characterPlanes[lowerIndex].SetRange(allocator, partialLower, Chars<char16>::MaxUChar);
                lowerIndex++;
            }

            for(; lowerIndex < upperIndex; lowerIndex++)
            {
                this->characterPlanes[lowerIndex].SetRange(allocator, 0, Chars<char16>::MaxUChar);
            }

            this->characterPlanes[upperIndex].SetRange(allocator, 0, partialHigher);
        }
    }